

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O0

ON_ReferencedComponentSettings * __thiscall
ON_ReferencedComponentSettings::operator=
          (ON_ReferencedComponentSettings *this,ON_ReferencedComponentSettings *src)

{
  ON_ReferencedComponentSettingsImpl *pOVar1;
  ON_ReferencedComponentSettings *src_local;
  ON_ReferencedComponentSettings *this_local;
  
  if (this->m_impl != src->m_impl) {
    if ((this->m_impl != (ON_ReferencedComponentSettingsImpl *)0x0) &&
       (pOVar1 = this->m_impl, pOVar1 != (ON_ReferencedComponentSettingsImpl *)0x0)) {
      ON_ReferencedComponentSettingsImpl::~ON_ReferencedComponentSettingsImpl(pOVar1);
      operator_delete(pOVar1,0x60);
    }
    if (src->m_impl != (ON_ReferencedComponentSettingsImpl *)0x0) {
      pOVar1 = (ON_ReferencedComponentSettingsImpl *)operator_new(0x60);
      ON_ReferencedComponentSettingsImpl::ON_ReferencedComponentSettingsImpl(pOVar1,src->m_impl);
      this->m_impl = pOVar1;
    }
  }
  return this;
}

Assistant:

ON_ReferencedComponentSettings& ON_ReferencedComponentSettings::operator=(const ON_ReferencedComponentSettings& src)
{
  if (m_impl != src.m_impl)
  {
    if (nullptr != m_impl)
      delete m_impl;
    if (nullptr != src.m_impl)
      m_impl = new ON_ReferencedComponentSettingsImpl(*src.m_impl);
  }
  return *this;
}